

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O1

void __thiscall
SuiteDataDictionaryTests::TestgetMessageOrderedFields_StoredOrder::
~TestgetMessageOrderedFields_StoredOrder(TestgetMessageOrderedFields_StoredOrder *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(getMessageOrderedFields_StoredOrder) {
  DataDictionary dictionary;
  dictionary.preserveMessageFieldsOrder(true);

  dictionary.addMsgField("msg", 1);
  dictionary.addMsgField("msg", 2);
  dictionary.addMsgField("msg", 3);


  message_order msg_order = dictionary.getMessageOrderedFields("msg");

  FieldMap fieldMap(msg_order);
  fieldMap.setField(3, "Field3");
  fieldMap.setField(1, "Field1");
  fieldMap.setField(2, "Field2");

  int pos1 = 0, pos2 = 0, pos3 = 0;
  int iterationCount = 0;
  for( FieldMap::iterator itr = fieldMap.begin(); itr != fieldMap.end(); itr++, iterationCount++) {
    if(iterationCount == 0) {
      pos1 = itr->getTag();
    } else if (iterationCount == 1 ) {
      pos2 = itr->getTag();
    } else if (iterationCount == 2) {
      pos3 = itr->getTag();
    }
  }

  CHECK_EQUAL(1, pos1);
  CHECK_EQUAL(2, pos2);
  CHECK_EQUAL(3, pos3);
}